

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fileutils.c
# Opt level: O1

void guess_ca_certs(char *filename,X509_NAME *issuer_name,X509 **sigc,X509 **encc,X509 **issuer_cert
                   )

{
  X509 *pXVar1;
  bool bVar2;
  char *pcVar3;
  int iVar4;
  X509 *pXVar5;
  X509_NAME *pXVar6;
  X509_NAME *b;
  int *piVar7;
  X509 **ppXVar8;
  char *pcVar9;
  ulong uVar10;
  ulong uVar11;
  ulong uVar12;
  int iVar13;
  uint uVar14;
  bool bVar15;
  X509 *cert [20];
  char name [1024];
  X509 *local_4d8 [20];
  char local_438 [1032];
  
  uVar11 = 0;
  iVar4 = 1;
  do {
    iVar13 = iVar4;
    if (uVar11 == 0x14) {
      uVar14 = 0x14;
      goto LAB_0010e3e3;
    }
    snprintf(local_438,0x3ff,"%s-%d",filename,uVar11 & 0xffffffff);
    pXVar5 = read_cert(local_438);
    local_4d8[uVar11] = pXVar5;
    uVar11 = uVar11 + 1;
    iVar4 = iVar13 + -1;
  } while (pXVar5 != (X509 *)0x0);
  uVar14 = -(iVar13 + -1);
LAB_0010e3e3:
  *encc = local_4d8[0];
  *sigc = local_4d8[0];
  uVar11 = (ulong)uVar14;
  if (0 < (int)uVar14) {
    uVar12 = 0;
    do {
      pXVar1 = (X509 *)local_4d8[uVar12];
      pXVar6 = X509_get_subject_name(pXVar1);
      bVar2 = false;
      uVar10 = 1;
      do {
        b = X509_get_issuer_name((X509 *)local_4d8[uVar10 - 1]);
        iVar4 = X509_NAME_cmp(pXVar6,b);
        if (iVar4 == 0) {
          bVar2 = true;
          break;
        }
        bVar15 = uVar10 < uVar11;
        uVar10 = uVar10 + 1;
      } while (bVar15);
      if ((issuer_name != (X509_NAME *)0x0) &&
         (iVar4 = X509_NAME_cmp((X509_NAME *)issuer_name,pXVar6), iVar4 == 0)) {
        *issuer_cert = (X509 *)pXVar1;
      }
      if (!bVar2) {
        piVar7 = (int *)X509_get_ext_d2i(pXVar1,0x53,(int *)0x0,(int *)0x0);
        if ((piVar7 == (int *)0x0) || (*piVar7 < 1)) {
          *encc = (X509 *)pXVar1;
          ppXVar8 = sigc;
        }
        else {
          if (**(char **)(piVar7 + 2) < '\0') {
            *sigc = (X509 *)pXVar1;
          }
          ppXVar8 = encc;
          if ((**(byte **)(piVar7 + 2) & 0x20) == 0) goto LAB_0010e4cb;
        }
        *ppXVar8 = (X509 *)pXVar1;
      }
LAB_0010e4cb:
      uVar12 = uVar12 + 1;
    } while (uVar12 != uVar11);
  }
  if (0 < (int)uVar14) {
    uVar12 = 0;
    do {
      pXVar1 = (X509 *)local_4d8[uVar12];
      if (((pXVar1 != (X509 *)*sigc) && (pXVar1 != (X509 *)*encc)) &&
         (pXVar1 != (X509 *)*issuer_cert)) {
        X509_free(pXVar1);
      }
      uVar12 = uVar12 + 1;
    } while (uVar11 != uVar12);
  }
  pcVar3 = pname;
  if (v_flag != 0) {
    if ((X509 *)*sigc != (X509 *)0x0) {
      pXVar6 = X509_get_subject_name((X509 *)*sigc);
      pcVar9 = X509_NAME_oneline(pXVar6,local_438,0x400);
      printf("%s: using RA certificate: %s\n",pcVar3,pcVar9);
    }
    pcVar3 = pname;
    if ((X509 *)*encc != (X509 *)0x0) {
      pXVar6 = X509_get_subject_name((X509 *)*encc);
      pcVar9 = X509_NAME_oneline(pXVar6,local_438,0x400);
      printf("%s: using RA encryption certificate: %s\n",pcVar3,pcVar9);
    }
    pcVar3 = pname;
    if ((X509 *)*issuer_cert != (X509 *)0x0) {
      pXVar6 = X509_get_subject_name((X509 *)*issuer_cert);
      pcVar9 = X509_NAME_oneline(pXVar6,local_438,0x400);
      printf("%s: using issuer certificate: %s\n",pcVar3,pcVar9);
    }
  }
  return;
}

Assistant:

void
guess_ca_certs(const char* filename, X509_NAME *issuer_name,
			   X509 **sigc, X509 **encc, X509 **issuer_cert)
{
	int ccnt, i, j;
	X509 *cert[20];

	ccnt = 0;
	/* read all certificates */
	while (ccnt < 20) {
		char name[1024];

		snprintf(name, sizeof(name)-1, "%s-%d", filename, ccnt);
		if (!(cert[ccnt] = read_cert(name)))
			break;

		ccnt++;
	}

	/* this is either NULL or the first certificate */
	*sigc = *encc = cert[0];

	for (i = 0; i < ccnt; i++) {
		X509_NAME *myname = X509_get_subject_name(cert[i]);
		int is_issuer = 0;

		/* the right CA is the final-one, either leaf or not */
		for (j = 0; j < ccnt; j++) {
			X509_NAME *issuer = X509_get_issuer_name(cert[j]);
			if (!X509_NAME_cmp(myname, issuer)) {
				is_issuer = 1;
				break;
			}
		}

		if (issuer_name != NULL && !X509_NAME_cmp(issuer_name, myname))
			*issuer_cert = cert[i];

		if (!is_issuer) {
			/* X509_get_key_usage(cert[i]) is not in older openssl */
			ASN1_BIT_STRING *usage = X509_get_ext_d2i(cert[i], NID_key_usage, NULL, NULL);
			if (usage && (usage->length > 0)) {
				if (usage->data[0] & KU_DIGITAL_SIGNATURE)
					*sigc = cert[i];
				if (usage->data[0] & KU_KEY_ENCIPHERMENT)
					*encc = cert[i];
			} else {
				/* no usability constraints */
				*sigc = *encc = cert[i];
			}
		}
	}

	/* release those we don't use */
	for (i = 0; i < ccnt; i++) {
		if (cert[i] != *sigc && cert[i] != *encc && cert[i] != *issuer_cert)
			X509_free(cert[i]);
	}

	if (v_flag) {
		char buffer[1024];

		if (*sigc)
			printf("%s: using RA certificate: %s\n", pname,
				X509_NAME_oneline(X509_get_subject_name(*sigc),
						buffer, sizeof(buffer)));
		if (*encc)
			printf("%s: using RA encryption certificate: %s\n", pname,
				X509_NAME_oneline(X509_get_subject_name(*encc),
						buffer, sizeof(buffer)));
		if (*issuer_cert)
			printf("%s: using issuer certificate: %s\n", pname,
				X509_NAME_oneline(X509_get_subject_name(*issuer_cert),
						buffer, sizeof(buffer)));
	}

}